

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O1

ImageFeatureType_EnumeratedImageSizes * __thiscall
CoreML::Specification::ImageFeatureType::mutable_enumeratedsizes(ImageFeatureType *this)

{
  ulong uVar1;
  ImageFeatureType_EnumeratedImageSizes *pIVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x15) {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x15;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pIVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes>(arena)
    ;
    (this->SizeFlexibility_).enumeratedsizes_ = pIVar2;
  }
  return (this->SizeFlexibility_).enumeratedsizes_;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes* ImageFeatureType::mutable_enumeratedsizes() {
  ::CoreML::Specification::ImageFeatureType_EnumeratedImageSizes* _msg = _internal_mutable_enumeratedsizes();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.enumeratedSizes)
  return _msg;
}